

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void set_max_size_cb(Fl_Button *param_1,void *v)

{
  Fl_Widget *pFVar1;
  bool bVar2;
  Fl_Widget_Type *pFVar3;
  int iVar4;
  Fl_Type *pFVar5;
  
  if ((char *)v != "LOAD") {
    if (Fl_Type::first == (Fl_Type *)0x0) {
      propagate_load(&the_panel->super_Fl_Group,"LOAD");
      return;
    }
    bVar2 = false;
    pFVar5 = Fl_Type::first;
    do {
      if (pFVar5->selected != '\0') {
        iVar4 = (*pFVar5->_vptr_Fl_Type[0x21])(pFVar5);
        pFVar3 = current_widget;
        if (iVar4 != 0) {
          pFVar1 = current_widget->o;
          *(int *)&current_widget[1].super_Fl_Type.next = pFVar1->w_;
          *(int *)((long)&pFVar3[1].super_Fl_Type.next + 4) = pFVar1->h_;
          bVar2 = true;
        }
      }
      pFVar5 = pFVar5->next;
    } while (pFVar5 != (Fl_Type *)0x0);
    propagate_load(&the_panel->super_Fl_Group,"LOAD");
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void set_max_size_cb(Fl_Button*, void* v) {
  if (v == LOAD) {
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        Fl_Window_Type *win = (Fl_Window_Type*)current_widget;
        win->sr_max_w = win->o->w();
        win->sr_max_h = win->o->h();
        mod = 1;
      }
    }
    propagate_load(the_panel, LOAD);
    if (mod) set_modflag(1);
  }
}